

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_values.cc
# Opt level: O1

bool bssl::der::anon_unknown_3::DecimalStringToUint<unsigned_short>
               (ByteReader *in,size_t digits,unsigned_short *out)

{
  bool bVar1;
  ulong uVar2;
  unsigned_short uVar3;
  bool bVar4;
  uint8_t digit;
  byte local_39;
  unsigned_short *local_38;
  
  bVar4 = digits == 0;
  local_38 = out;
  if (bVar4) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    uVar2 = 1;
    do {
      bVar1 = ByteReader::ReadByte(in,&local_39);
      if ((bVar1) && (0xf5 < (byte)(local_39 - 0x3a))) {
        uVar3 = ((ushort)local_39 + uVar3 * 10) - 0x30;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      if (!bVar1) break;
      bVar4 = digits <= uVar2;
      bVar1 = uVar2 != digits;
      uVar2 = uVar2 + 1;
    } while (bVar1);
  }
  if (bVar4 != false) {
    *local_38 = uVar3;
  }
  return bVar4;
}

Assistant:

bool DecimalStringToUint(ByteReader &in, size_t digits, UINT *out) {
  UINT value = 0;
  for (size_t i = 0; i < digits; ++i) {
    uint8_t digit;
    if (!in.ReadByte(&digit)) {
      return false;
    }
    if (digit < '0' || digit > '9') {
      return false;
    }
    value = (value * 10) + (digit - '0');
  }
  *out = value;
  return true;
}